

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__compute_transparency(stbi__png *z,stbi_uc *tc,int out_n)

{
  char cVar1;
  uint uVar2;
  int in_EDX;
  char *in_RSI;
  undefined8 *in_RDI;
  stbi_uc *p;
  stbi__uint32 pixel_count;
  stbi__uint32 i;
  stbi__context *s;
  char *local_30;
  uint local_24;
  
  uVar2 = *(int *)*in_RDI * ((int *)*in_RDI)[1];
  local_30 = (char *)in_RDI[3];
  if (in_EDX != 2 && in_EDX != 4) {
    __assert_fail("out_n == 2 || out_n == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                  ,0x11bf,"int stbi__compute_transparency(stbi__png *, stbi_uc *, int)");
  }
  if (in_EDX == 2) {
    for (local_24 = 0; local_24 < uVar2; local_24 = local_24 + 1) {
      cVar1 = -1;
      if (*local_30 == *in_RSI) {
        cVar1 = '\0';
      }
      local_30[1] = cVar1;
      local_30 = local_30 + 2;
    }
  }
  else {
    for (local_24 = 0; local_24 < uVar2; local_24 = local_24 + 1) {
      if (((*local_30 == *in_RSI) && (local_30[1] == in_RSI[1])) && (local_30[2] == in_RSI[2])) {
        local_30[3] = '\0';
      }
      local_30 = local_30 + 4;
    }
  }
  return 1;
}

Assistant:

static int stbi__compute_transparency(stbi__png *z, stbi_uc tc[3], int out_n)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi_uc *p = z->out;

   // compute color-based transparency, assuming we've
   // already got 255 as the alpha value in the output
   STBI_ASSERT(out_n == 2 || out_n == 4);

   if (out_n == 2) {
      for (i=0; i < pixel_count; ++i) {
         p[1] = (p[0] == tc[0] ? 0 : 255);
         p += 2;
      }
   } else {
      for (i=0; i < pixel_count; ++i) {
         if (p[0] == tc[0] && p[1] == tc[1] && p[2] == tc[2])
            p[3] = 0;
         p += 4;
      }
   }
   return 1;
}